

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_smdb.c
# Opt level: O1

uintptr_t mpt_hash_smdb(void *data,int len)

{
  uintptr_t uVar1;
  char cVar2;
  long lVar3;
  char *str;
  char *pcVar4;
  
  if (data != (void *)0x0) {
    if (len < 0) {
      cVar2 = *data;
      if (cVar2 != '\0') {
        pcVar4 = (char *)((long)data + 1);
        uVar1 = 0;
        do {
          uVar1 = (long)cVar2 + uVar1 * 0x1003f;
          cVar2 = *pcVar4;
          pcVar4 = pcVar4 + 1;
        } while (cVar2 != '\0');
        return uVar1;
      }
    }
    else if (len != 0) {
      lVar3 = 0;
      uVar1 = 0;
      do {
        uVar1 = (long)*(char *)((long)data + lVar3) + uVar1 * 0x1003f;
        lVar3 = lVar3 + 1;
      } while (len != (int)lVar3);
      return uVar1;
    }
  }
  return 0;
}

Assistant:

extern uintptr_t mpt_hash_smdb(const void *data, int len)
{
	const char *str;
	uintptr_t hash = 0;
	
	if (!(str = data)) {
		return 0;
	}
	if (len < 0) {
		while (*str) {
			hash = (hash * 65599) + *str++;
		}
		return hash;
	}
	while (len--) {
		hash = (hash * 65599) + *str++;
	}
	return hash;
}